

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O2

istream * operator>>(istream *s,Circuit *C)

{
  vector<GateType,_std::allocator<GateType>_> *this;
  uint uVar1;
  int iVar2;
  istream *piVar3;
  runtime_error *this_00;
  GateType GVar4;
  uint j;
  ulong uVar5;
  ulong uVar6;
  size_type __new_size;
  uint in;
  uint out;
  uint te;
  uint nG;
  string ss;
  
  piVar3 = std::istream::_M_extract<unsigned_int>((uint *)s);
  std::istream::_M_extract<unsigned_int>((uint *)piVar3);
  this = &C->GateT;
  std::vector<GateType,_std::allocator<GateType>_>::resize(this,(ulong)nG);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&C->GateI,(ulong)nG);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&C->GateO,(ulong)nG);
  std::istream::_M_extract<unsigned_int>((uint *)s);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&C->numI,(ulong)te);
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(C->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(C->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    std::istream::_M_extract<unsigned_int>((uint *)s);
  }
  std::istream::_M_extract<unsigned_int>((uint *)s);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&C->numO,(ulong)te);
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(C->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(C->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
    std::istream::_M_extract<unsigned_int>((uint *)s);
  }
  ss._M_dataplus._M_p = (pointer)&ss.field_2;
  ss._M_string_length = 0;
  ss.field_2._M_local_buf[0] = '\0';
  uVar5 = 0;
  do {
    if (nG <= (uint)uVar5) {
      Circuit::recompute_map(C);
      std::__cxx11::string::~string((string *)&ss);
      return s;
    }
    piVar3 = std::istream::_M_extract<unsigned_int>((uint *)s);
    std::istream::_M_extract<unsigned_int>((uint *)piVar3);
    __new_size = (size_type)in;
    if ((int)in < 3) {
      __new_size = 2;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((C->GateI).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,__new_size);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((C->GateO).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,(ulong)out);
    for (uVar6 = 0; uVar6 < in; uVar6 = uVar6 + 1) {
      std::istream::_M_extract<unsigned_int>((uint *)s);
    }
    for (uVar6 = 0; uVar6 < out; uVar6 = uVar6 + 1) {
      std::istream::_M_extract<unsigned_int>((uint *)s);
    }
    std::operator>>(s,(string *)&ss);
    iVar2 = std::__cxx11::string::compare((char *)&ss);
    if (iVar2 == 0) {
      (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = AND;
LAB_00103ad3:
      if (in != 2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Circuit error");
        goto LAB_00103bac;
      }
LAB_00103ada:
      if (out != 1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Circuit error");
LAB_00103bac:
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&ss);
      if (iVar2 == 0) {
        (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar5] = XOR;
        goto LAB_00103ad3;
      }
      iVar2 = std::__cxx11::string::compare((char *)&ss);
      GVar4 = INV;
      if (iVar2 == 0) {
LAB_00103aa6:
        (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar5] = GVar4;
LAB_00103ab6:
        if (in != 1) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Circuit error");
          goto LAB_00103bac;
        }
        goto LAB_00103ada;
      }
      iVar2 = std::__cxx11::string::compare((char *)&ss);
      GVar4 = EQ;
      if (iVar2 == 0) goto LAB_00103aa6;
      iVar2 = std::__cxx11::string::compare((char *)&ss);
      if (iVar2 == 0) {
        (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar5] = EQW;
        goto LAB_00103ab6;
      }
      iVar2 = std::__cxx11::string::compare((char *)&ss);
      if (iVar2 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Circuit error");
        goto LAB_00103bac;
      }
      (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar5] = MAND;
      if (out != in >> 1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Circuit error");
        goto LAB_00103bac;
      }
    }
    uVar5 = (ulong)((uint)uVar5 + 1);
  } while( true );
}

Assistant:

istream &operator>>(istream &s, Circuit &C) {
  unsigned int nG, te;
  s >> nG >> C.nWires;

  C.GateT.resize(nG);
  C.GateI.resize(nG);
  C.GateO.resize(nG);

  s >> te;
  C.numI.resize(te);
  for (unsigned int i = 0; i < C.numI.size(); i++) {
    s >> C.numI[i];
  }

  s >> te;
  C.numO.resize(te);
  for (unsigned int i = 0; i < C.numO.size(); i++) {
    s >> C.numO[i];
  }

  unsigned int in, out;
  string ss;
  for (unsigned int i = 0; i < nG; i++) {
    s >> in >> out;
    C.GateI[i].resize(max(2, (int)in));
    C.GateO[i].resize(out);
    for (unsigned int j = 0; j < in; j++) {
      s >> C.GateI[i][j];
    }
    for (unsigned int j = 0; j < out; j++) {
      s >> C.GateO[i][j];
    }
    s >> ss;
    if (ss.compare("AND") == 0) {
      C.GateT[i] = AND;
    } else if (ss.compare("XOR") == 0) {
      C.GateT[i] = XOR;
    } else if (ss.compare("INV") == 0) {
      C.GateT[i] = INV;
    } else if (ss.compare("EQ") == 0) {
      C.GateT[i] = EQ;
    } else if (ss.compare("EQW") == 0) {
      C.GateT[i] = EQW;
    } else if (ss.compare("MAND") == 0) {
      C.GateT[i] = MAND;
    } else {
      throw std::runtime_error("Circuit error");
    }

    // Check dimensions of in and out are all OK
    if ((C.GateT[i] == INV || C.GateT[i] == EQ || C.GateT[i] == EQW) &&
        in != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == AND || C.GateT[i] == XOR) && in != 2) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] != MAND) && out != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == MAND) && out != in / 2) {
      throw std::runtime_error("Circuit error");
    }
  }

  C.recompute_map();

  return s;
}